

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

int __thiscall ON_Brep::AddEdgeCurve(ON_Brep *this,ON_Curve *pC)

{
  int local_20;
  int local_1c;
  int dim;
  int c3i;
  ON_Curve *pC_local;
  ON_Brep *this_local;
  
  local_1c = -1;
  if (pC != (ON_Curve *)0x0) {
    _dim = pC;
    pC_local = (ON_Curve *)this;
    local_20 = (*(pC->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])();
    if (local_20 != 3) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep.cpp"
                 ,0x742,"","ON_Brep::AddEdgeCurve() got a non-3d curve - changing dim to 3.");
      (*(_dim->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(_dim,3);
      local_20 = (*(_dim->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])();
    }
    if (local_20 == 3) {
      local_1c = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>);
      ON_SimpleArray<ON_Curve_*>::Append
                (&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&dim);
    }
  }
  return local_1c;
}

Assistant:

int 
ON_Brep::AddEdgeCurve( ON_Curve* pC )
{
  int c3i = -1;
  if ( 0 != pC )
  {

    int dim = pC->Dimension();

    if ( dim != 3 )
    {
      // 7 April 2003 Dale Lear: (See comment in ON_Brep::AddTrimCurve().)
      ON_ERROR("ON_Brep::AddEdgeCurve() got a non-3d curve - changing dim to 3.");
      pC->ChangeDimension(3);
      dim = pC->Dimension();
    }
    
    if ( 3 == dim )
    {
      c3i = m_C3.Count();
      m_C3.Append(pC);
    }
  }
  return c3i;
}